

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Graph_map(MPIABI_Comm comm,int nnodes,int *index,int *edges,int *newrank)

{
  int iVar1;
  ompi_communicator_t *poVar2;
  WPI_Handle<ompi_communicator_t_*> local_38;
  int *local_30;
  int *newrank_local;
  int *edges_local;
  int *index_local;
  MPIABI_Comm MStack_10;
  int nnodes_local;
  MPIABI_Comm comm_local;
  
  local_30 = newrank;
  newrank_local = edges;
  edges_local = index;
  index_local._4_4_ = nnodes;
  MStack_10 = comm;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle(&local_38,comm);
  poVar2 = WPI_Handle::operator_cast_to_ompi_communicator_t_((WPI_Handle *)&local_38);
  iVar1 = MPI_Graph_map(poVar2,index_local._4_4_,edges_local,newrank_local,local_30);
  return iVar1;
}

Assistant:

int MPIABI_Graph_map(
  MPIABI_Comm comm,
  int nnodes,
  const int * index,
  const int * edges,
  int * newrank
) {
  return MPI_Graph_map(
    (MPI_Comm)(WPI_Comm)comm,
    nnodes,
    index,
    edges,
    newrank
  );
}